

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O0

ptrdiff_t rcnb_decode_block(wchar_t *code_in,size_t length_in,char *plaintext_out,
                           rcnb_decodestate *state_in)

{
  undefined4 uVar1;
  ulong uVar2;
  _Bool _Var3;
  ulong *in_RCX;
  char **in_RDX;
  wchar_t *in_RSI;
  undefined4 *in_RDI;
  size_t j;
  wchar_t i;
  _Bool res;
  char *plaintext_char;
  ulong local_40;
  int local_38;
  char **value_out;
  undefined4 *local_10;
  long local_8;
  
  local_10 = in_RDI;
  for (; *in_RCX < 4 && in_RSI != (wchar_t *)0x0; in_RSI = (wchar_t *)((long)in_RSI + -1)) {
    uVar1 = *local_10;
    uVar2 = *in_RCX;
    *in_RCX = uVar2 + 1;
    *(undefined4 *)((long)in_RCX + uVar2 * 4 + 8) = uVar1;
    local_10 = local_10 + 1;
  }
  if (in_RSI == (wchar_t *)0x0) {
    local_8 = 0;
  }
  else {
    value_out = in_RDX;
    _Var3 = rcnb_decode_short(in_RSI,in_RDX);
    if (_Var3) {
      *in_RCX = 0;
      for (local_38 = 0; (ulong)(long)local_38 < (ulong)in_RSI >> 2; local_38 = local_38 + 1) {
        _Var3 = rcnb_decode_short(in_RSI,value_out);
        if (!_Var3) {
          return -1;
        }
      }
      *in_RCX = (ulong)in_RSI & 3;
      for (local_40 = 0; local_40 < *in_RCX; local_40 = local_40 + 1) {
        *(undefined4 *)((long)in_RCX + local_40 * 4 + 8) =
             local_10[(long)in_RSI + (local_40 - *in_RCX)];
      }
      *(undefined1 *)in_RDX = 0;
      local_8 = (long)in_RDX - (long)value_out;
    }
    else {
      local_8 = -1;
    }
  }
  return local_8;
}

Assistant:

ptrdiff_t rcnb_decode_block(const wchar_t* code_in, size_t length_in,
        char* const plaintext_out, rcnb_decodestate* state_in)
{
    char* plaintext_char = plaintext_out;
    bool res;
    while (state_in->i < 4 && length_in > 0) {
        state_in->trailing_code[state_in->i++] = code_in[0];
        length_in--;
        code_in++;
    }
    if (length_in == 0)
        return 0;
    res = rcnb_decode_short(state_in->trailing_code, &plaintext_char);
    if (!res)
        return -1;
    state_in->i = 0;
#if defined(ENABLE_AVX2) || defined(ENABLE_SSSE3) || defined(ENABLE_NEON)
    size_t batch = length_in >> 6;
    if (batch > 0) {
        res = rcnb_decode_32n_asm((const char *)code_in, plaintext_char, batch);
        if (!res)
            return -1;
    }
    plaintext_char += 32 * batch;
    code_in += 64 * batch;
    length_in = length_in & 63;
#endif
    for (int i = 0; i < (length_in >> 2); ++i) {
        res = rcnb_decode_short(code_in + i * 4, &plaintext_char);
        if (!res)
            return -1;
    }
    state_in->i = length_in % 4;
    for (size_t j = 0; j < state_in->i; ++j) {
        state_in->trailing_code[j] = code_in[length_in - state_in->i + j];
    }
    *plaintext_char = 0;
    return plaintext_char - plaintext_out;
}